

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void readliteral_truecolour(BinarySource *bs,termchar *c,termline *ldata,unsigned_long *state)

{
  byte bVar1;
  uchar uVar2;
  
  bVar1 = BinarySource_get_byte(bs->binarysource_);
  if ((bVar1 & 1) == 0) {
    (c->truecolour).fg.enabled = false;
    (c->truecolour).fg.r = '\0';
    (c->truecolour).fg.g = '\0';
    (c->truecolour).fg.b = '\0';
  }
  else {
    (c->truecolour).fg.enabled = true;
    uVar2 = BinarySource_get_byte(bs->binarysource_);
    (c->truecolour).fg.r = uVar2;
    uVar2 = BinarySource_get_byte(bs->binarysource_);
    (c->truecolour).fg.g = uVar2;
    uVar2 = BinarySource_get_byte(bs->binarysource_);
    (c->truecolour).fg.b = uVar2;
  }
  if ((bVar1 & 2) == 0) {
    (c->truecolour).bg.enabled = false;
    (c->truecolour).bg.r = '\0';
    (c->truecolour).bg.g = '\0';
    (c->truecolour).bg.b = '\0';
  }
  else {
    (c->truecolour).bg.enabled = true;
    uVar2 = BinarySource_get_byte(bs->binarysource_);
    (c->truecolour).bg.r = uVar2;
    uVar2 = BinarySource_get_byte(bs->binarysource_);
    (c->truecolour).bg.g = uVar2;
    uVar2 = BinarySource_get_byte(bs->binarysource_);
    (c->truecolour).bg.b = uVar2;
  }
  return;
}

Assistant:

static void readliteral_truecolour(
    BinarySource *bs, termchar *c, termline *ldata, unsigned long *state)
{
    int flags = get_byte(bs);

    if (flags & 1) {
        c->truecolour.fg.enabled = true;
        c->truecolour.fg.r = get_byte(bs);
        c->truecolour.fg.g = get_byte(bs);
        c->truecolour.fg.b = get_byte(bs);
    } else {
        c->truecolour.fg = optionalrgb_none;
    }

    if (flags & 2) {
        c->truecolour.bg.enabled = true;
        c->truecolour.bg.r = get_byte(bs);
        c->truecolour.bg.g = get_byte(bs);
        c->truecolour.bg.b = get_byte(bs);
    } else {
        c->truecolour.bg = optionalrgb_none;
    }
}